

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  __type _Var1;
  bool bVar2;
  string *__lhs;
  FileOptions *pFVar3;
  ulong uVar4;
  char *pcVar5;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  int local_19c;
  undefined1 local_198 [4];
  int file_name_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  char local_f2 [2];
  char *local_f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *php_metadata_namespace;
  undefined4 local_b4;
  string local_b0 [4];
  int lastindex;
  string file_no_suffix;
  undefined1 local_88 [8];
  string segment;
  allocator local_51;
  undefined1 local_50 [8];
  string result;
  int first_index;
  int start_index;
  string *proto_file;
  Options *options_local;
  FileDescriptor *file_local;
  
  __lhs = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  result.field_2._12_4_ = 0;
  result.field_2._8_4_ = std::__cxx11::string::find_first_of((char *)__lhs,0x7788de);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_88,"",(allocator *)(file_no_suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file_no_suffix.field_2._M_local_buf + 0xf));
  _Var1 = std::operator==(__lhs,&kEmptyFile_abi_cxx11_);
  if (_Var1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kEmptyMetadataFile_abi_cxx11_);
    file_no_suffix.field_2._8_4_ = 1;
  }
  else if (((byte)*file & 1) == 0) {
    std::__cxx11::string::string(local_b0);
    local_b4 = std::__cxx11::string::find_last_of((char *)__lhs,0x7c9082);
    _Var1 = std::operator==(__lhs,&kEmptyFile_abi_cxx11_);
    if (_Var1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&kEmptyMetadataFile_abi_cxx11_);
    }
    else {
      std::__cxx11::string::substr((ulong)&php_metadata_namespace,(ulong)__lhs);
      std::__cxx11::string::operator=(local_b0,(string *)&php_metadata_namespace);
      std::__cxx11::string::~string((string *)&php_metadata_namespace);
      pFVar3 = FileDescriptor::options((FileDescriptor *)this);
      bVar2 = FileOptions::has_php_metadata_namespace(pFVar3);
      if (bVar2) {
        pFVar3 = FileDescriptor::options((FileDescriptor *)this);
        local_e0 = FileOptions::php_metadata_namespace_abi_cxx11_(pFVar3);
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) && (bVar2 = std::operator!=(local_e0,"\\"), bVar2)) {
          std::__cxx11::string::operator+=((string *)local_50,(string *)local_e0);
          local_e8._M_current = (char *)std::__cxx11::string::begin();
          local_f0 = (char *)std::__cxx11::string::end();
          local_f2[1] = 0x5c;
          local_f2[0] = '/';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (local_e8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )local_f0,local_f2 + 1,local_f2);
          std::__cxx11::string::size();
          pcVar5 = (char *)std::__cxx11::string::at((ulong)local_50);
          if (*pcVar5 != '/') {
            std::__cxx11::string::operator+=((string *)local_50,"/");
          }
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)local_50,"GPBMetadata/");
        while (result.field_2._8_4_ != -1) {
          std::__cxx11::string::substr((ulong)&local_138,(ulong)local_b0);
          anon_unknown_2::UnderscoresToCamelCase(&local_118,&local_138,true);
          std::__cxx11::string::operator=((string *)local_88,(string *)&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_138);
          anon_unknown_2::ReservedNamePrefix
                    ((string *)local_198,(string *)local_88,(FileDescriptor *)this);
          std::operator+(&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          std::operator+(&local_158,&local_178,"/");
          std::__cxx11::string::operator+=((string *)local_50,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)local_198);
          result.field_2._12_4_ = result.field_2._8_4_ + 1;
          result.field_2._8_4_ = std::__cxx11::string::find_first_of((char *)local_b0,0x7788de);
        }
      }
      local_19c = std::__cxx11::string::find_last_of((char *)local_b0,0x7788de);
      if (local_19c == -1) {
        local_19c = 0;
      }
      else {
        local_19c = local_19c + 1;
      }
      std::__cxx11::string::substr((ulong)&local_1e0,(ulong)local_b0);
      anon_unknown_2::UnderscoresToCamelCase(&local_1c0,&local_1e0,true);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      anon_unknown_2::ReservedNamePrefix(&local_240,(string *)local_88,(FileDescriptor *)this);
      std::operator+(&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_240);
      std::operator+(&local_200,&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(__return_storage_ptr__,&local_200,".php");
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    file_no_suffix.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_b0);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kDescriptorMetadataFile_abi_cxx11_);
    file_no_suffix.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  const std::string& proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (options.is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    const std::string& php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      result += php_metadata_namespace;
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        result += "/";
      }
    }
  } else {
    result += "GPBMetadata/";
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      result += ReservedNamePrefix(segment, file) + segment + "/";
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of("/", start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of("/");
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start), true);

  return result + ReservedNamePrefix(segment, file) + segment + ".php";
}